

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

bool chaiscript::eval::
     AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
     get_scoped_bool_condition
               (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node
               ,Dispatch_State *t_ss)

{
  bool bVar1;
  Scope_Push_Pop spp;
  Scope_Push_Pop local_28;
  undefined1 local_20 [16];
  
  local_28.m_ds = t_ss;
  chaiscript::detail::Dispatch_Engine::new_scope((t_ss->m_stack_holder)._M_data);
  eval((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)local_20,
       (Dispatch_State *)node);
  bVar1 = AST_Node::get_bool_condition((Boxed_Value *)local_20,t_ss);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_20 + 8));
  detail::Scope_Push_Pop::~Scope_Push_Pop(&local_28);
  return bVar1;
}

Assistant:

static bool get_scoped_bool_condition(const AST_Node_Impl<T> &node, const chaiscript::detail::Dispatch_State &t_ss) {
        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);
        return get_bool_condition(node.eval(t_ss), t_ss);
      }